

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::emit_peephole_findmsb(Impl *impl,Instruction *instruction)

{
  uint32_t uVar1;
  Instruction *impl_00;
  bool bVar2;
  Predicate PVar3;
  BinaryOps BVar4;
  uint uVar5;
  Value *pVVar6;
  APInt *this;
  int64_t iVar7;
  CmpInst *pCVar8;
  Type *this_00;
  Value *value;
  GLSLstd450 local_68;
  uint32_t local_64;
  GLSLstd450 opcode;
  uint32_t const_val_1;
  BinaryOperator *sub_inst;
  ConstantInt *true_const_value;
  CmpInst *pCStack_48;
  uint32_t const_val;
  CmpInst *cmp;
  CallInst *clz_instruction;
  Value *false_value;
  Value *true_value;
  Value *cond;
  Instruction *instruction_local;
  Impl *impl_local;
  
  cond = &instruction->super_Value;
  instruction_local = (Instruction *)impl;
  true_value = LLVMBC::Instruction::getOperand(instruction,0);
  false_value = LLVMBC::Instruction::getOperand((Instruction *)cond,1);
  clz_instruction = (CallInst *)LLVMBC::Instruction::getOperand((Instruction *)cond,2);
  cmp = (CmpInst *)0x0;
  pCStack_48 = LLVMBC::dyn_cast<LLVMBC::CmpInst>(true_value);
  if ((pCStack_48 != (CmpInst *)0x0) &&
     (PVar3 = LLVMBC::CmpInst::getPredicate(pCStack_48), PVar3 == ICMP_EQ)) {
    pVVar6 = LLVMBC::Instruction::getOperand(&pCStack_48->super_Instruction,0);
    bVar2 = value_is_dx_op_instrinsic(pVVar6,FirstbitHi);
    if (!bVar2) {
      pVVar6 = LLVMBC::Instruction::getOperand(&pCStack_48->super_Instruction,0);
      bVar2 = value_is_dx_op_instrinsic(pVVar6,FirstbitSHi);
      if (!bVar2) {
        return false;
      }
    }
    true_const_value._4_4_ = 0;
    bVar2 = get_constant_operand
                      (&pCStack_48->super_Instruction,1,(uint32_t *)((long)&true_const_value + 4));
    if ((bVar2) && (true_const_value._4_4_ == -1)) {
      pVVar6 = LLVMBC::Instruction::getOperand(&pCStack_48->super_Instruction,0);
      cmp = (CmpInst *)LLVMBC::cast<LLVMBC::CallInst>(pVVar6);
      sub_inst = (BinaryOperator *)LLVMBC::dyn_cast<LLVMBC::ConstantInt>(false_value);
      if (sub_inst != (BinaryOperator *)0x0) {
        this = LLVMBC::Constant::getUniqueInteger((Constant *)sub_inst);
        iVar7 = LLVMBC::APInt::getSExtValue(this);
        if ((((iVar7 == -1) &&
             (_opcode = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>((Value *)clz_instruction),
             _opcode != (BinaryOperator *)0x0)) &&
            (BVar4 = LLVMBC::BinaryOperator::getOpcode(_opcode), BVar4 == Sub)) &&
           (pCVar8 = (CmpInst *)LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,1),
           pCVar8 == cmp)) {
          local_64 = 0;
          bVar2 = get_constant_operand(&_opcode->super_Instruction,0,&local_64);
          uVar1 = local_64;
          if (bVar2) {
            pVVar6 = LLVMBC::Instruction::getOperand(&cmp->super_Instruction,1);
            this_00 = LLVMBC::Value::getType(pVVar6);
            uVar5 = LLVMBC::Type::getIntegerBitWidth(this_00);
            if (uVar1 == uVar5 - 1) {
              bVar2 = value_is_dx_op_instrinsic((Value *)cmp,FirstbitHi);
              impl_00 = instruction_local;
              pVVar6 = cond;
              if (bVar2) {
                local_68 = GLSLstd450FindUMsb;
              }
              else {
                local_68 = GLSLstd450FindSMsb;
              }
              value = LLVMBC::Instruction::getOperand(&cmp->super_Instruction,1);
              emit_native_bitscan(local_68,(Impl *)impl_00,(Instruction *)pVVar6,value);
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool emit_peephole_findmsb(Converter::Impl &impl, const llvm::Instruction *instruction)
{
	// DXIL is CLZ, while original HLSL is Vulkan-style findMSB. Peephole the double-conversion pattern.
	auto *cond = instruction->getOperand(0);
	auto *true_value = instruction->getOperand(1);
	auto *false_value = instruction->getOperand(2);
	const llvm::CallInst *clz_instruction = nullptr;

	// Optimize clz(x) == -1 ? -1 : (bits - 1 - clz(x)) -> findmsb(x)

	if (auto *cmp = llvm::dyn_cast<llvm::CmpInst>(cond))
	{
		if (cmp->getPredicate() != llvm::CmpInst::Predicate::ICMP_EQ)
			return false;

		if (!value_is_dx_op_instrinsic(cmp->getOperand(0), DXIL::Op::FirstbitHi) &&
		    !value_is_dx_op_instrinsic(cmp->getOperand(0), DXIL::Op::FirstbitSHi))
			return false;

		uint32_t const_val = 0;
		if (!get_constant_operand(cmp, 1, &const_val) || const_val != UINT32_MAX)
			return false;

		clz_instruction = llvm::cast<llvm::CallInst>(cmp->getOperand(0));
	}
	else
		return false;

	if (auto *true_const_value = llvm::dyn_cast<llvm::ConstantInt>(true_value))
	{
		if (true_const_value->getUniqueInteger().getSExtValue() != -1)
			return false;
	}
	else
		return false;

	if (auto *sub_inst = llvm::dyn_cast<llvm::BinaryOperator>(false_value))
	{
		if (sub_inst->getOpcode() != llvm::Instruction::BinaryOps::Sub)
			return false;

		if (sub_inst->getOperand(1) != clz_instruction)
			return false;

		uint32_t const_val = 0;
		if (!get_constant_operand(sub_inst, 0, &const_val) ||
		    const_val != clz_instruction->getOperand(1)->getType()->getIntegerBitWidth() - 1)
		{
			return false;
		}
	}
	else
		return false;

	GLSLstd450 opcode;
	if (value_is_dx_op_instrinsic(clz_instruction, DXIL::Op::FirstbitHi))
		opcode = GLSLstd450FindUMsb;
	else
		opcode = GLSLstd450FindSMsb;

	emit_native_bitscan(opcode, impl, instruction, clz_instruction->getOperand(1));
	return true;
}